

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,unsigned_long>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<unsigned_int&&>,std::tuple<unsigned_long&&>>
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,unsigned_long>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>
           *this,size_t i,piecewise_construct_t *args,tuple<unsigned_int_&&> *args_1,
          tuple<unsigned_long_&&> *args_2)

{
  long lVar1;
  unsigned_long *puVar2;
  long lVar3;
  const_iterator cVar4;
  FindElement local_18;
  
  lVar1 = *(long *)(this + 8);
  lVar3 = i * 0x10;
  puVar2 = (args_2->super__Tuple_impl<0UL,_unsigned_long_&&>).
           super__Head_base<0UL,_unsigned_long_&&,_false>._M_head_impl;
  *(uint *)(lVar1 + lVar3) =
       *(args_1->super__Tuple_impl<0UL,_unsigned_int_&&>).
        super__Head_base<0UL,_unsigned_int_&&,_false>._M_head_impl;
  *(unsigned_long *)(lVar1 + 8 + lVar3) = *puVar2;
  local_18.s = (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                *)this;
  cVar4 = DecomposePair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,unsigned_long>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>::FindElement,std::pair<unsigned_int_const,unsigned_long>&>
                    (&local_18,(pair<const_unsigned_int,_unsigned_long> *)(lVar1 + lVar3));
  if (cVar4.inner_.ctrl_ == (ctrl_t *)(i + *(long *)this)) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) == iterator_at(i) && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x802,
                "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned int, unsigned long>, phmap::Hash<uint32_t>, phmap::EqualTo<unsigned int>, std::allocator<std::pair<const unsigned int, unsigned long>>>::emplace_at(size_t, Args &&...) [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned int, unsigned long>, Hash = phmap::Hash<uint32_t>, Eq = phmap::EqualTo<unsigned int>, Alloc = std::allocator<std::pair<const unsigned int, unsigned long>>, Args = <const std::piecewise_construct_t &, std::tuple<unsigned int &&>, std::tuple<unsigned long &&>>]"
               );
}

Assistant:

void emplace_at(size_t i, Args&&... args) {
        PolicyTraits::construct(&alloc_ref(), slots_ + i,
                                std::forward<Args>(args)...);

        assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
               iterator_at(i) &&
               "constructed value does not match the lookup key");
    }